

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

axbStatus_t op_vec_axpy(axbVec_s *y,axbScalar_s *alpha,axbVec_s *x,void *aux_data)

{
  ulong uVar1;
  void *pvVar2;
  double *pdVar3;
  void *pvVar4;
  ulong uVar5;
  
  uVar1 = y->size;
  pvVar2 = y->data;
  pdVar3 = (double *)alpha->data;
  pvVar4 = x->data;
  for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
    *(double *)((long)pvVar2 + uVar5 * 8) =
         *pdVar3 * *(double *)((long)pvVar4 + uVar5 * 8) + *(double *)((long)pvVar2 + uVar5 * 8);
  }
  return 0;
}

Assistant:

static axbStatus_t op_vec_axpy(struct axbVec_s *y, const struct axbScalar_s *alpha, const struct axbVec_s *x, void *aux_data)
{
  (void)aux_data;

        double *d_y     =       (double*)y->data;
  const double *d_alpha = (const double*)alpha->data;
  const double *d_x     = (const double*)x->data;

  for (size_t i=0; i<y->size; ++i) d_y[i] += *d_alpha * d_x[i];

  return 0;
}